

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O2

ImgClass * __thiscall Webcam::snap(ImgClass *__return_storage_ptr__,Webcam *this)

{
  size_t sVar1;
  
  isStreamMode = false;
  frame();
  sVar1 = jpgClean(imgBuffer[0].data,(long)imgBuffer[0].size);
  imgBuffer[0].size = (int)sVar1;
  ImgClass::ImgClass(__return_storage_ptr__,imgBuffer);
  return __return_storage_ptr__;
}

Assistant:

ImgClass Webcam::snap()
{
    isStreamMode = false;
    frame();
    imgBuffer[0].size = jpgClean(imgBuffer[0].data, imgBuffer[0].size);
    return ImgClass(imgBuffer[0]);
}